

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprImpliesNotNull(Parse *pParse,Expr *p,Expr *pNN,int iTab,int seenNot)

{
  byte bVar1;
  ExprList *pEVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
LAB_00189f4c:
  iVar3 = sqlite3ExprCompare(pParse,p,pNN,iTab);
  if (iVar3 == 0) {
    uVar5 = (uint)(pNN->op != 'y');
switchD_00189f86_caseD_70:
    return uVar5;
  }
  bVar1 = p->op;
  uVar5 = 0;
  uVar4 = (uint)bVar1;
  if (bVar1 < 0x66) {
    if (0x33 < bVar1) {
      if (5 < uVar4 - 0x34) {
        return 0;
      }
switchD_00189f86_caseD_67:
      seenNot = 1;
      goto switchD_00189f86_caseD_66;
    }
    if (uVar4 == 0x13) {
switchD_00189f86_caseD_72:
      seenNot = 1;
    }
    else if (uVar4 == 0x30) {
      if (seenNot != 0) {
        return 0;
      }
      pEVar2 = (p->x).pList;
      iVar3 = exprImpliesNotNull(pParse,pEVar2->a[0].pExpr,pNN,iTab,1);
      if (iVar3 != 0) {
        return 1;
      }
      seenNot = 1;
      iVar3 = exprImpliesNotNull(pParse,*(Expr **)(pEVar2 + 1),pNN,iTab,1);
      if (iVar3 != 0) {
        return 1;
      }
    }
    else {
      if (uVar4 != 0x31) {
        return 0;
      }
      if (seenNot == 0) goto switchD_00189f86_caseD_72;
      seenNot = 1;
      if ((p->flags & 0x1000) != 0) {
        return 0;
      }
    }
  }
  else {
    if (uVar4 < 0xad) {
      switch(uVar4) {
      case 0x66:
      case 0x6c:
      case 0x6d:
      case 0x6e:
        goto switchD_00189f86_caseD_66;
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6f:
        goto switchD_00189f86_caseD_67;
      default:
        goto switchD_00189f86_caseD_70;
      case 0x71:
        goto switchD_00189f86_caseD_71;
      case 0x72:
        goto switchD_00189f86_caseD_72;
      }
    }
    if (1 < bVar1 - 0xad) {
      if (uVar4 == 0xaf) {
        if (seenNot != 0) {
          return 0;
        }
        seenNot = 1;
        if (p->op2 != '-') {
          return 0;
        }
      }
      else if (uVar4 != 0xb5) {
        return 0;
      }
    }
  }
switchD_00189f86_caseD_71:
  p = p->pLeft;
  goto LAB_00189f4c;
switchD_00189f86_caseD_66:
  iVar3 = exprImpliesNotNull(pParse,p->pRight,pNN,iTab,seenNot);
  if (iVar3 != 0) {
    return 1;
  }
  goto switchD_00189f86_caseD_71;
}

Assistant:

static int exprImpliesNotNull(
  const Parse *pParse,/* Parsing context */
  const Expr *p,      /* The expression to be checked */
  const Expr *pNN,    /* The expression that is NOT NULL */
  int iTab,           /* Table being evaluated */
  int seenNot         /* Return true only if p can be any non-NULL value */
){
  assert( p );
  assert( pNN );
  if( sqlite3ExprCompare(pParse, p, pNN, iTab)==0 ){
    return pNN->op!=TK_NULL;
  }
  switch( p->op ){
    case TK_IN: {
      if( seenNot && ExprHasProperty(p, EP_xIsSelect) ) return 0;
      assert( ExprUseXSelect(p) || (p->x.pList!=0 && p->x.pList->nExpr>0) );
      return exprImpliesNotNull(pParse, p->pLeft, pNN, iTab, 1);
    }
    case TK_BETWEEN: {
      ExprList *pList;
      assert( ExprUseXList(p) );
      pList = p->x.pList;
      assert( pList!=0 );
      assert( pList->nExpr==2 );
      if( seenNot ) return 0;
      if( exprImpliesNotNull(pParse, pList->a[0].pExpr, pNN, iTab, 1)
       || exprImpliesNotNull(pParse, pList->a[1].pExpr, pNN, iTab, 1)
      ){
        return 1;
      }
      return exprImpliesNotNull(pParse, p->pLeft, pNN, iTab, 1);
    }
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_PLUS:
    case TK_MINUS:
    case TK_BITOR:
    case TK_LSHIFT:
    case TK_RSHIFT:
    case TK_CONCAT:
      seenNot = 1;
      /* no break */ deliberate_fall_through
    case TK_STAR:
    case TK_REM:
    case TK_BITAND:
    case TK_SLASH: {
      if( exprImpliesNotNull(pParse, p->pRight, pNN, iTab, seenNot) ) return 1;
      /* no break */ deliberate_fall_through
    }
    case TK_SPAN:
    case TK_COLLATE:
    case TK_UPLUS:
    case TK_UMINUS: {
      return exprImpliesNotNull(pParse, p->pLeft, pNN, iTab, seenNot);
    }
    case TK_TRUTH: {
      if( seenNot ) return 0;
      if( p->op2!=TK_IS ) return 0;
      return exprImpliesNotNull(pParse, p->pLeft, pNN, iTab, 1);
    }
    case TK_BITNOT:
    case TK_NOT: {
      return exprImpliesNotNull(pParse, p->pLeft, pNN, iTab, 1);
    }
  }
  return 0;
}